

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O2

void FSE_initCState2(FSE_CState_t *statePtr,FSE_CTable *ct,U32 symbol)

{
  uint uVar1;
  ushort uVar2;
  long lVar3;
  
  uVar2 = (ushort)*ct;
  statePtr->stateTable = ct + 1;
  lVar3 = 1;
  if (uVar2 != 0) {
    lVar3 = (long)(1 << ((char)uVar2 - 1U & 0x1f));
  }
  statePtr->symbolTT = ct + lVar3 + 1;
  statePtr->stateLog = (uint)uVar2;
  uVar1 = ct[lVar3 + (ulong)symbol * 2 + 2] + 0x8000;
  statePtr->value =
       (ulong)*(ushort *)
               ((long)ct +
               (long)(int)(ct + lVar3 + 1)[(ulong)symbol * 2] * 2 +
               (ulong)((uVar1 & 0xffff0000) - ct[lVar3 + (ulong)symbol * 2 + 2] >>
                      ((byte)(uVar1 >> 0x10) & 0x3f)) * 2 + 4);
  return;
}

Assistant:

MEM_STATIC U16 MEM_read16(const void* ptr) { return ((const unalign16*)ptr)->v; }